

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O2

void __thiscall
Model::Model(Model *this,string *filename,bool diffuse_texture,bool normal_map,bool specular_texture
            )

{
  int iVar1;
  istream *piVar2;
  long *plVar3;
  vec<3UL,_double> *__x;
  ostream *poVar4;
  undefined7 in_register_00000009;
  undefined7 in_register_00000011;
  Model *pMVar5;
  undefined3 in_register_00000081;
  size_t i;
  size_t sVar6;
  char trash;
  Model *local_520;
  string *local_518;
  undefined4 local_50c;
  undefined4 local_508;
  undefined4 local_504;
  int n;
  int t;
  TGAImage *local_4f8;
  TGAImage *local_4f0;
  TGAImage *local_4e8;
  vector<vec<2UL,_double>,_std::allocator<vec<2UL,_double>_>_> *local_4e0;
  vector<vec<3UL,_double>,_std::allocator<vec<3UL,_double>_>_> *local_4d8;
  vector<int,_std::allocator<int>_> *local_4d0;
  vector<int,_std::allocator<int>_> *local_4c8;
  vector<int,_std::allocator<int>_> *local_4c0;
  string line;
  int f;
  undefined4 uStack_494;
  double dStack_490;
  double local_488;
  undefined1 local_478 [32];
  string local_458;
  undefined1 local_438 [32];
  string local_418;
  undefined1 local_3f8 [32];
  string local_3d8;
  ifstream in;
  byte abStack_398 [488];
  istringstream iss;
  
  local_50c = CONCAT31(in_register_00000081,specular_texture);
  local_508 = (undefined4)CONCAT71(in_register_00000009,normal_map);
  local_504 = (undefined4)CONCAT71(in_register_00000011,diffuse_texture);
  local_4e0 = &this->uv_;
  local_4d8 = &this->norms_;
  local_4c0 = &this->facet_vrt_;
  local_4c8 = &this->facet_tex_;
  local_4d0 = &this->facet_nrm_;
  local_518 = filename;
  memset(this,0,0x90);
  local_520 = this;
  local_4e8 = &this->diffusemap_;
  TGAImage::TGAImage(&this->diffusemap_);
  local_4f0 = &this->normalmap_;
  TGAImage::TGAImage(local_4f0);
  local_4f8 = &this->specularmap_;
  TGAImage::TGAImage(local_4f8);
  std::ifstream::ifstream(&in);
  std::ifstream::open((string *)&in,(_Ios_Openmode)local_518);
  if ((abStack_398[(long)_in[-1].x] & 5) == 0) {
    line._M_dataplus._M_p = (pointer)&line.field_2;
    line._M_string_length = 0;
    line.field_2._M_local_buf[0] = '\0';
    while ((abStack_398[(long)_in[-1].x] & 2) == 0) {
      std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)&in,(string *)&line)
      ;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&f,line._M_dataplus._M_p,(allocator<char> *)&t);
      std::__cxx11::istringstream::istringstream((istringstream *)&iss,(string *)&f,_S_in);
      std::__cxx11::string::~string((string *)&f);
      iVar1 = std::__cxx11::string::compare((ulong)&line,0,(char *)0x2);
      if (iVar1 == 0) {
        std::operator>>((istream *)&iss,&trash);
        _f = 0.0;
        dStack_490 = 0.0;
        local_488 = 0.0;
        for (sVar6 = 0; sVar6 != 3; sVar6 = sVar6 + 1) {
          vec<3UL,_double>::operator[]((vec<3UL,_double> *)&f,sVar6);
          std::istream::_M_extract<double>((double *)&iss);
        }
        std::vector<vec<3UL,_double>,_std::allocator<vec<3UL,_double>_>_>::push_back
                  (&local_520->verts_,(vec<3UL,_double> *)&f);
      }
      else {
        iVar1 = std::__cxx11::string::compare((ulong)&line,0,(char *)0x3);
        if (iVar1 == 0) {
          piVar2 = std::operator>>((istream *)&iss,&trash);
          std::operator>>(piVar2,&trash);
          _f = 0.0;
          dStack_490 = 0.0;
          local_488 = 0.0;
          for (sVar6 = 0; sVar6 != 3; sVar6 = sVar6 + 1) {
            vec<3UL,_double>::operator[]((vec<3UL,_double> *)&f,sVar6);
            std::istream::_M_extract<double>((double *)&iss);
          }
          __x = vec<3UL,_double>::normalize((vec<3UL,_double> *)&f);
          std::vector<vec<3UL,_double>,_std::allocator<vec<3UL,_double>_>_>::push_back
                    (local_4d8,__x);
        }
        else {
          iVar1 = std::__cxx11::string::compare((ulong)&line,0,(char *)0x3);
          if (iVar1 == 0) {
            piVar2 = std::operator>>((istream *)&iss,&trash);
            std::operator>>(piVar2,&trash);
            _f = 0.0;
            dStack_490 = 0.0;
            for (sVar6 = 0; sVar6 != 2; sVar6 = sVar6 + 1) {
              vec<2UL,_double>::operator[]((vec<2UL,_double> *)&f,sVar6);
              std::istream::_M_extract<double>((double *)&iss);
            }
            std::vector<vec<2UL,_double>,_std::allocator<vec<2UL,_double>_>_>::push_back
                      (local_4e0,(value_type *)&f);
          }
          else {
            iVar1 = std::__cxx11::string::compare((ulong)&line,0,(char *)0x2);
            if (iVar1 == 0) {
              std::operator>>((istream *)&iss,&trash);
              iVar1 = 3;
              while( true ) {
                piVar2 = (istream *)std::istream::operator>>((istream *)&iss,&f);
                piVar2 = std::operator>>(piVar2,&trash);
                piVar2 = (istream *)std::istream::operator>>(piVar2,&t);
                piVar2 = std::operator>>(piVar2,&trash);
                plVar3 = (long *)std::istream::operator>>(piVar2,&n);
                if ((*(byte *)((long)plVar3 + *(long *)(*plVar3 + -0x18) + 0x20) & 5) != 0) break;
                _f = (double)CONCAT44(uStack_494,f + -1);
                std::vector<int,_std::allocator<int>_>::push_back
                          (local_4c0,(value_type_conflict3 *)&f);
                t = t + -1;
                std::vector<int,_std::allocator<int>_>::push_back
                          (local_4c8,(value_type_conflict3 *)&t);
                n = n + -1;
                std::vector<int,_std::allocator<int>_>::push_back(local_4d0,&n);
                iVar1 = iVar1 + -1;
              }
              if (iVar1 != 0) {
                poVar4 = std::operator<<((ostream *)&std::cerr,
                                         "Error: the obj file is supposed to be triangulated");
                std::endl<char,std::char_traits<char>>(poVar4);
                std::ifstream::close();
                std::__cxx11::istringstream::~istringstream((istringstream *)&iss);
                goto LAB_00106546;
              }
            }
          }
        }
      }
      std::__cxx11::istringstream::~istringstream((istringstream *)&iss);
    }
    std::ifstream::close();
    poVar4 = std::operator<<((ostream *)&std::cerr,"# v# ");
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    poVar4 = std::operator<<(poVar4," f# ");
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    poVar4 = std::operator<<(poVar4," vt# ");
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    poVar4 = std::operator<<(poVar4," vn# ");
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::endl<char,std::char_traits<char>>(poVar4);
    if ((char)local_504 != '\0') {
      std::__cxx11::string::string((string *)(local_3f8 + 0x20),(string *)local_518);
      pMVar5 = (Model *)local_3f8;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)pMVar5,"_diffuse.tga",(allocator<char> *)&iss);
      load_texture(pMVar5,(string *)(local_3f8 + 0x20),(string *)local_3f8,local_4e8);
      std::__cxx11::string::~string((string *)local_3f8);
      std::__cxx11::string::~string((string *)(local_3f8 + 0x20));
    }
    if ((char)local_508 != '\0') {
      std::__cxx11::string::string((string *)(local_438 + 0x20),(string *)local_518);
      pMVar5 = (Model *)local_438;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)pMVar5,"_nm_tangent.tga",(allocator<char> *)&iss);
      load_texture(pMVar5,(string *)(local_438 + 0x20),(string *)local_438,local_4f0);
      std::__cxx11::string::~string((string *)local_438);
      std::__cxx11::string::~string((string *)(local_438 + 0x20));
    }
    if ((char)local_50c != '\0') {
      std::__cxx11::string::string((string *)(local_478 + 0x20),(string *)local_518);
      pMVar5 = (Model *)local_478;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)pMVar5,"_spec.tga",(allocator<char> *)&iss);
      load_texture(pMVar5,(string *)(local_478 + 0x20),(string *)local_478,local_4f8);
      std::__cxx11::string::~string((string *)local_478);
      std::__cxx11::string::~string((string *)(local_478 + 0x20));
    }
LAB_00106546:
    std::__cxx11::string::~string((string *)&line);
  }
  std::ifstream::~ifstream(&in);
  return;
}

Assistant:

Model::Model(const std::string filename, bool diffuse_texture, bool normal_map,
             bool specular_texture)
{
    std::ifstream in;
    in.open(filename, std::ifstream::in);
    if (in.fail()) return;
    std::string line;
    while (!in.eof()) {
        std::getline(in, line);
        std::istringstream iss(line.c_str());
        char trash;
        if (!line.compare(0, 2, "v ")) {
            iss >> trash;
            vec3f v;
            for (size_t i = 0; i < 3; i++) iss >> v[i];
            verts_.push_back(v);
        } else if (!line.compare(0, 3, "vn ")) {
            iss >> trash >> trash;
            vec3f n;
            for (size_t i = 0; i < 3; i++) iss >> n[i];
            norms_.push_back(n.normalize());
        } else if (!line.compare(0, 3, "vt ")) {
            iss >> trash >> trash;
            vec2f uv;
            for (size_t i = 0; i < 2; i++) iss >> uv[i];
            uv_.push_back(uv);
        } else if (!line.compare(0, 2, "f ")) {
            int f, t, n;
            iss >> trash;
            int cnt = 0;
            while (iss >> f >> trash >> t >> trash >> n) {
                facet_vrt_.push_back(--f);
                facet_tex_.push_back(--t);
                facet_nrm_.push_back(--n);
                cnt++;
            }
            if (3 != cnt) {
                std::cerr << "Error: the obj file is supposed to be triangulated" << std::endl;
                in.close();
                return;
            }
        }
    }
    in.close();
    std::cerr << "# v# " << nverts() << " f# " << nfaces() << " vt# " << uv_.size() << " vn# "
              << norms_.size() << std::endl;
    if (diffuse_texture) load_texture(filename, "_diffuse.tga", diffusemap_);
    if (normal_map) load_texture(filename, "_nm_tangent.tga", normalmap_);
    if (specular_texture) load_texture(filename, "_spec.tga", specularmap_);
}